

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputIterator.hpp
# Opt level: O2

KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> * __thiscall
supermap::io::
InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
::next(KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>
       *__return_storage_ptr__,
      InputIterator<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_3UL,_void>
      *this)

{
  istream *is;
  
  this->index_ = this->index_ + 1;
  is = (istream *)
       (*(code *)**(undefined8 **)
                   (this->input_)._M_t.
                   super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
                   .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl)();
  DeserializeHelper<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_void>
  ::deserialize(__return_storage_ptr__,is);
  return __return_storage_ptr__;
}

Assistant:

T next() {
        ++index_;
        return deserialize<T>(input_->get());
    }